

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  long *plVar1;
  Extension *pEVar2;
  int iVar3;
  Label *v1;
  Label *v2;
  char *pcVar4;
  LogMessage *pLVar5;
  CppType *v1_00;
  CppType *v2_00;
  Descriptor *pDVar6;
  undefined8 uVar7;
  ExtensionSet *local_98;
  MessageLite *ret;
  Voidify local_79;
  CppType local_78;
  CppType local_74;
  Nullable<const_char_*> local_70;
  LogMessage local_58;
  Voidify local_41;
  Label local_40;
  Label local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  iVar3 = FieldDescriptor::number(descriptor);
  absl_log_internal_check_op_result = (Nullable<const_char_*>)FindOrNull(this,iVar3);
  if ((Extension *)absl_log_internal_check_op_result == (Extension *)0x0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    local_3c = LABEL_OPTIONAL;
    if ((((Extension *)absl_log_internal_check_op_result)->is_repeated & 1U) != 0) {
      local_3c = LABEL_REPEATED;
    }
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_3c);
    local_40 = LABEL_OPTIONAL;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                         (v1,v2,
                          "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                         );
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xa7,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_74 = internal::cpp_type(absl_log_internal_check_op_result[8]);
    v1_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                      (&local_74);
    local_78 = CPPTYPE_MESSAGE;
    v2_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                      (&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (v1_00,v2_00,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    pEVar2 = extension;
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&ret,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0xa7,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&ret);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ret);
    }
    if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
      if (this->arena_ == (Arena *)0x0) {
        local_98 = *(ExtensionSet **)absl_log_internal_check_op_result;
      }
      else {
        local_98 = (ExtensionSet *)
                   MessageLite::New(*(MessageLite **)absl_log_internal_check_op_result);
        MessageLite::CheckTypeAndMergeFrom
                  ((MessageLite *)local_98,*(MessageLite **)absl_log_internal_check_op_result);
      }
    }
    else {
      plVar1 = *(long **)absl_log_internal_check_op_result;
      pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      uVar7 = (**(code **)((pEVar2->field_0).int64_t_value + 0x10))(pEVar2,pDVar6);
      local_98 = (ExtensionSet *)(**(code **)(*plVar1 + 0x40))(plVar1,uVar7,this->arena_);
      if ((this->arena_ == (Arena *)0x0) &&
         (*(long **)absl_log_internal_check_op_result != (long *)0x0)) {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
      }
    }
    iVar3 = FieldDescriptor::number((FieldDescriptor *)factory_local);
    Erase(this,iVar3);
    this_local = local_98;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->ptr.lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
      if (arena_ == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ != nullptr) {
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      } else {
        ret = extension->ptr.message_value;
      }
    }
    Erase(descriptor->number());
    return ret;
  }
}